

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void * Memalign(size_t align,size_t size)

{
  unsigned_long uVar1;
  void *pvVar2;
  size_t size_local;
  size_t align_local;
  
  uVar1 = noopt<unsigned_long>(size);
  pvVar2 = (void *)memalign(align,uVar1);
  pvVar2 = noopt<void*>(pvVar2);
  return pvVar2;
}

Assistant:

static inline void* Memalign(size_t align, size_t size) {
  return noopt(memalign(align, noopt(size)));
}